

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<std::optional<solitaire::cards::Card>_&> * __thiscall
testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::operator=
          (MatcherBase<std::optional<solitaire::cards::Card>_&> *this,
          MatcherBase<std::optional<solitaire::cards::Card>_&> *other)

{
  MatcherBase<std::optional<solitaire::cards::Card>_&> *other_local;
  MatcherBase<std::optional<solitaire::cards::Card>_&> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }